

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall slang::ast::TypePrinter::printAKA(TypePrinter *this,Type *type)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  Type *this_00;
  Type *this_01;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  this_00 = type;
  do {
    do {
      do {
        this_01 = this_00;
        if ((this_01->super_Symbol).kind != TypeAlias) goto LAB_003f453b;
        this_00 = DeclaredType::getType((DeclaredType *)(this_01 + 1));
      } while ((this_00->super_Symbol).name._M_len != 0);
      bVar1 = Type::isArray(this_00);
    } while (bVar1);
    bVar1 = Type::isVirtualInterface(this_00);
  } while (bVar1);
LAB_003f453b:
  if (this_01 != type) {
    __x._M_len = (this_01->super_Symbol).name._M_len;
    __x._M_str = (this_01->super_Symbol).name._M_str;
    __y._M_len = (type->super_Symbol).name._M_len;
    __y._M_str = (type->super_Symbol).name._M_str;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) {
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl," (aka \'","");
      local_30._M_len = 0;
      local_30._M_str = "";
      Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
                (&this_01->super_Symbol,this,&local_30);
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"\')","");
    }
  }
  return;
}

Assistant:

void TypePrinter::printAKA(const Type& type) {
    // Only print the AKA if the target type has a real name.
    // The typedefs can chain, so we want to walk down the chain
    // and take the last named type we see.
    const Type* target = &type;
    while (target->isAlias()) {
        const Type& newTarget = target->as<TypeAliasType>().targetType.getType();
        if (newTarget.name.empty() && !newTarget.isArray() && !newTarget.isVirtualInterface())
            break;

        target = &newTarget;
    }

    if (target != &type && target->name != type.name) {
        buffer->append(" (aka '");
        target->visit(*this, ""sv);
        buffer->append("')");
    }
}